

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test_utils.hpp
# Opt level: O0

void __thiscall
unodb::test::
tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::insert_internal(tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                  *this,key_type k,value_view v,bool bypass_verifier)

{
  value_view v_00;
  key_type k_00;
  bool bVar1;
  char *pcVar2;
  const_reference pvVar3;
  mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  *this_00;
  undefined1 uVar4;
  undefined7 in_register_00000089;
  pair<std::_Rb_tree_iterator<std::pair<const_std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_bool>
  pVar5;
  key_type key;
  size_t local_458;
  string local_448;
  AssertHelper local_428;
  Message local_420;
  undefined1 local_418 [8];
  AssertionResult gtest_ar__1;
  type *insert_succeeded;
  type *pos;
  undefined1 local_3d8 [24];
  undefined1 local_3c0;
  pause_heap_faults local_3b1;
  pause_heap_faults guard;
  Message local_3a8;
  unsigned_long local_3a0;
  undefined1 local_398 [8];
  AssertionResult gtest_ar_9;
  Message local_380;
  int local_374;
  undefined1 local_370 [8];
  AssertionResult gtest_ar_8;
  value_type_conflict2 leaf_count_after;
  Message local_350;
  undefined1 local_348 [8];
  AssertionResult gtest_ar_7;
  Message local_330;
  int local_324;
  undefined1 local_320 [8];
  AssertionResult gtest_ar_6;
  size_t mem_use_after;
  AssertHelper local_2e8;
  Message local_2e0;
  bool local_2d1;
  undefined1 local_2d0 [8];
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  uint64_t key_prefix_splits_before;
  inode_type_counter_array shrinking_inodes_before;
  inode_type_counter_array growing_inodes_before;
  node_type_counter_array node_counts_before;
  size_t mem_use_before;
  bool empty_before;
  bool bypass_verifier_local;
  tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  *this_local;
  value_view v_local;
  key_type k_local;
  
  v_local._M_ptr = (pointer)v._M_extent._M_extent_value;
  this_local = (tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                *)v._M_ptr;
  v_local._M_extent._M_extent_value = (size_t)k._M_ptr;
  uVar4 = bypass_verifier;
  mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::empty(&this->test_db);
  if ((this->parallel_test & 1U) == 0) {
    local_458 = mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                ::get_current_memory_use(&this->test_db);
  }
  else {
    local_458 = 0;
  }
  node_counts_before._M_elems[4] = local_458;
  this_00 = &this->test_db;
  mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::get_node_counts((node_type_counter_array *)(growing_inodes_before._M_elems + 3),this_00);
  mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::get_growing_inode_counts
            ((inode_type_counter_array *)(shrinking_inodes_before._M_elems + 3),this_00);
  mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::get_shrinking_inode_counts((inode_type_counter_array *)&key_prefix_splits_before,this_00);
  mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::get_key_prefix_splits(this_00);
  k_00._M_extent._M_extent_value = k._M_extent._M_extent_value._M_extent_value;
  k_00._M_ptr = (pointer)v_local._M_extent._M_extent_value;
  v_00._M_extent._M_extent_value = (size_t)v_local._M_ptr;
  v_00._M_ptr = (pointer)this_local;
  tree_verifier<unodb::mutex_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>
  ::
  do_insert<unodb::mutex_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>
            ((tree_verifier<unodb::mutex_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>
              *)this,k_00,v_00);
  bVar1 = mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
          ::empty(&this->test_db);
  local_2d1 = !bVar1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2d0,&local_2d1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d0);
  if (!bVar1) {
    testing::Message::Message(&local_2e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&mem_use_after,(internal *)local_2d0,(AssertionResult *)"test_db.empty()",
               "true","false",(char *)CONCAT71(in_register_00000089,uVar4));
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &mem_use_after);
    testing::internal::AssertHelper::AssertHelper
              (&local_2e8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
               ,0x18b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2e8,&local_2e0);
    testing::internal::AssertHelper::~AssertHelper(&local_2e8);
    std::__cxx11::string::~string((string *)&mem_use_after);
    testing::Message::~Message(&local_2e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d0);
  if (bVar1) {
    gtest_ar_6.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
           ::get_current_memory_use(&this->test_db);
    if ((this->parallel_test & 1U) == 0) {
      testing::internal::CmpHelperLT<unsigned_long,unsigned_long>
                ((internal *)local_348,"(mem_use_before)","(mem_use_after)",
                 node_counts_before._M_elems + 4,(unsigned_long *)&gtest_ar_6.message_);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_348);
      if (!bVar1) {
        testing::Message::Message(&local_350);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_348);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&leaf_count_after,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
                   ,0x192,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&leaf_count_after,&local_350);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&leaf_count_after);
        testing::Message::~Message(&local_350);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_348);
    }
    else {
      local_324 = 0;
      testing::internal::CmpHelperGT<unsigned_long,int>
                ((internal *)local_320,"(mem_use_after)","(0)",(unsigned_long *)&gtest_ar_6.message_
                 ,&local_324);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_320);
      if (!bVar1) {
        testing::Message::Message(&local_330);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_320);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_7.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
                   ,400,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_330);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
        testing::Message::~Message(&local_330);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_320);
    }
    if (bVar1) {
      gtest_ar_8.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
             ::get_node_count<(unodb::node_type)0>(&this->test_db);
      if ((this->parallel_test & 1U) == 0) {
        pvVar3 = std::array<unsigned_long,_5UL>::operator[]
                           ((array<unsigned_long,_5UL> *)(growing_inodes_before._M_elems + 3),0);
        local_3a0 = *pvVar3 + 1;
        testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                  ((EqHelper *)local_398,"(leaf_count_after)",
                   "(node_counts_before[as_i<unodb::node_type::LEAF>] + 1)",
                   (unsigned_long *)&gtest_ar_8.message_,&local_3a0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_398);
        if (!bVar1) {
          testing::Message::Message(&local_3a8);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_398);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&stack0xfffffffffffffc50,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
                     ,0x19a,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&stack0xfffffffffffffc50,&local_3a8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffc50);
          testing::Message::~Message(&local_3a8);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_398);
      }
      else {
        local_374 = 0;
        testing::internal::CmpHelperGT<unsigned_long,int>
                  ((internal *)local_370,"(leaf_count_after)","(0)",
                   (unsigned_long *)&gtest_ar_8.message_,&local_374);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_370);
        if (!bVar1) {
          testing::Message::Message(&local_380);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_370);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_9.message_,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
                     ,0x197,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_9.message_,&local_380);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
          testing::Message::~Message(&local_380);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_370);
      }
      if ((bVar1) && (!bypass_verifier)) {
        allocation_failure_injector::reset();
        pause_heap_faults::pause_heap_faults(&local_3b1);
        key._M_extent._M_extent_value = v_local._M_extent._M_extent_value;
        key._M_ptr = (pointer)this;
        to_ikey((tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                 *)local_3d8,key);
        pVar5 = std::
                map<std::shared_ptr<std::vector<std::byte,std::allocator<std::byte>>>,std::span<std::byte_const,18446744073709551615ul>,unodb::test::tree_verifier<unodb::mutex_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>::comparator,std::allocator<std::pair<std::shared_ptr<std::vector<std::byte,std::allocator<std::byte>>>const,std::span<std::byte_const,18446744073709551615ul>>>>
                ::try_emplace<std::span<std::byte_const,18446744073709551615ul>&>
                          ((map<std::shared_ptr<std::vector<std::byte,std::allocator<std::byte>>>,std::span<std::byte_const,18446744073709551615ul>,unodb::test::tree_verifier<unodb::mutex_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>::comparator,std::allocator<std::pair<std::shared_ptr<std::vector<std::byte,std::allocator<std::byte>>>const,std::span<std::byte_const,18446744073709551615ul>>>>
                            *)&this->values,(key_type *)local_3d8,
                           (span<const_std::byte,_18446744073709551615UL> *)&this_local);
        local_3d8._16_8_ = pVar5.first._M_node;
        local_3c0 = pVar5.second;
        std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>::~shared_ptr
                  ((shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_> *)local_3d8);
        std::
        get<0ul,std::_Rb_tree_iterator<std::pair<std::shared_ptr<std::vector<std::byte,std::allocator<std::byte>>>const,std::span<std::byte_const,18446744073709551615ul>>>,bool>
                  ((pair<std::_Rb_tree_iterator<std::pair<const_std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_bool>
                    *)(local_3d8 + 0x10));
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )std::
               get<1ul,std::_Rb_tree_iterator<std::pair<std::shared_ptr<std::vector<std::byte,std::allocator<std::byte>>>const,std::span<std::byte_const,18446744073709551615ul>>>,bool>
                         ((pair<std::_Rb_tree_iterator<std::pair<const_std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_bool>
                           *)(local_3d8 + 0x10));
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_418,
                   (bool *)gtest_ar__1.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_418);
        if (!bVar1) {
          testing::Message::Message(&local_420);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_448,(internal *)local_418,(AssertionResult *)"insert_succeeded","false",
                     "true",(char *)CONCAT71(in_register_00000089,uVar4));
          pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   c_str(&local_448);
          testing::internal::AssertHelper::AssertHelper
                    (&local_428,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
                     ,0x1a4,pcVar2);
          testing::internal::AssertHelper::operator=(&local_428,&local_420);
          testing::internal::AssertHelper::~AssertHelper(&local_428);
          std::__cxx11::string::~string((string *)&local_448);
          testing::Message::~Message(&local_420);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_418);
        pause_heap_faults::~pause_heap_faults(&local_3b1);
      }
    }
  }
  return;
}

Assistant:

void insert_internal(key_type k, unodb::value_view v,
                       bool bypass_verifier = false) {
    const auto empty_before = test_db.empty();
#ifdef UNODB_DETAIL_WITH_STATS
    const auto mem_use_before =
        parallel_test ? 0 : test_db.get_current_memory_use();
    const auto node_counts_before = test_db.get_node_counts();
    const auto growing_inodes_before = test_db.get_growing_inode_counts();
    const auto shrinking_inodes_before = test_db.get_shrinking_inode_counts();
    const auto key_prefix_splits_before = test_db.get_key_prefix_splits();
#endif  // UNODB_DETAIL_WITH_STATS

    try {
      do_insert(k, v);
    } catch (...) {
      if (!parallel_test) {
        UNODB_ASSERT_EQ(empty_before, test_db.empty());
#ifdef UNODB_DETAIL_WITH_STATS
        UNODB_ASSERT_EQ(mem_use_before, test_db.get_current_memory_use());
        UNODB_ASSERT_THAT(test_db.get_node_counts(),
                          ::testing::ElementsAreArray(node_counts_before));
        UNODB_ASSERT_THAT(test_db.get_growing_inode_counts(),
                          ::testing::ElementsAreArray(growing_inodes_before));
        UNODB_ASSERT_THAT(test_db.get_shrinking_inode_counts(),
                          ::testing::ElementsAreArray(shrinking_inodes_before));
        UNODB_ASSERT_EQ(test_db.get_key_prefix_splits(),
                        key_prefix_splits_before);
#endif  // UNODB_DETAIL_WITH_STATS
      }
      throw;
    }

    UNODB_ASSERT_FALSE(test_db.empty());

#ifdef UNODB_DETAIL_WITH_STATS
    const auto mem_use_after = test_db.get_current_memory_use();
    if (parallel_test)
      UNODB_ASSERT_GT(mem_use_after, 0);
    else
      UNODB_ASSERT_LT(mem_use_before, mem_use_after);

    const auto leaf_count_after =
        test_db.template get_node_count<unodb::node_type::LEAF>();
    if (parallel_test)
      UNODB_ASSERT_GT(leaf_count_after, 0);
    else
      UNODB_ASSERT_EQ(leaf_count_after,
                      node_counts_before[as_i<unodb::node_type::LEAF>] + 1);
#endif  // UNODB_DETAIL_WITH_STATS

    if (!bypass_verifier) {
#ifndef NDEBUG
      allocation_failure_injector::reset();
#endif
      UNODB_DETAIL_PAUSE_HEAP_TRACKING_GUARD();
      const auto [pos, insert_succeeded] = values.try_emplace(to_ikey(k), v);
      (void)pos;
      UNODB_ASSERT_TRUE(insert_succeeded);
    }
  }